

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O2

icu_std_converter<char,_1> * __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::icu
          (icu_std_converter<char,_1> *this,char_type *vb,char_type *ve)

{
  int in_ECX;
  UErrorCode err;
  uconv cvt;
  UErrorCode local_2c;
  uconv local_28;
  
  uconv::uconv(&local_28,(string *)(vb + 8),*(cpcvt_type *)(vb + 0x28));
  local_2c = U_ZERO_ERROR;
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)this,ve,in_ECX - (int)ve,local_28.cvt_,&local_2c);
  check_and_throw_icu_error(local_2c);
  uconv::~uconv(&local_28);
  return this;
}

Assistant:

icu::UnicodeString icu(char_type const *vb,char_type const *ve) const
        {
            char const *begin=reinterpret_cast<char const *>(vb);
            char const *end=reinterpret_cast<char const *>(ve);
            uconv cvt(charset_,cvt_type_);
            UErrorCode err=U_ZERO_ERROR;
            icu::UnicodeString tmp(begin,end-begin,cvt.cvt(),err);
            check_and_throw_icu_error(err);
            return tmp;
        }